

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O1

void __thiscall
google::protobuf::json_internal::ParseProto2Descriptor::SetString
          (ParseProto2Descriptor *this,Field f,Msg *msg,string_view x)

{
  ParseProto2Descriptor PVar1;
  Message *message;
  string *psVar2;
  undefined8 extraout_RAX;
  bool bVar3;
  size_t sVar4;
  long *unaff_RBP;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Alloc_hider _Var6;
  long lVar7;
  Metadata MVar8;
  string local_80;
  string local_60;
  
  sVar4 = x._M_len;
  RecordAsSeen((Field)this,(Msg *)f);
  PVar1 = this[1];
  bVar3 = (bool)(((byte)PVar1 & 0x20) >> 5);
  if (0xbf < (byte)PVar1 == bVar3) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < (byte)PVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar2 == (string *)0x0) {
    PVar1 = this[1];
    MVar8 = Message::GetMetadata(*(Message **)f);
    lVar7 = (long)&msg->msg_ + sVar4;
    message = *(Message **)f;
    if (((byte)PVar1 & 0x20) == 0) {
      paVar5 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,sVar4,lVar7);
      Reflection::SetString(MVar8.reflection,message,(FieldDescriptor *)this,&local_80);
      _Var6._M_p = local_80._M_dataplus._M_p;
    }
    else {
      paVar5 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,sVar4,lVar7);
      Reflection::AddString(MVar8.reflection,message,(FieldDescriptor *)this,&local_60);
      _Var6._M_p = local_60._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar5) {
      operator_delete(_Var6._M_p,paVar5->_M_allocated_capacity + 1);
    }
    return;
  }
  SetString();
  if ((long *)local_60._M_dataplus._M_p != unaff_RBP) {
    operator_delete(local_60._M_dataplus._M_p,*unaff_RBP + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddString(msg.msg_, f, std::string(x));
    } else {
      msg.msg_->GetReflection()->SetString(msg.msg_, f, std::string(x));
    }
  }